

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DataTypeClamp(ImGuiDataType data_type,void *p_data,void *p_min,void *p_max)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  undefined4 in_EDI;
  bool local_1;
  
  switch(in_EDI) {
  case 0:
    local_1 = DataTypeClampT<signed_char>((char *)in_RSI,(char *)in_RDX,(char *)in_RCX);
    break;
  case 1:
    local_1 = DataTypeClampT<unsigned_char>((uchar *)in_RSI,(uchar *)in_RDX,(uchar *)in_RCX);
    break;
  case 2:
    local_1 = DataTypeClampT<short>((short *)in_RSI,(short *)in_RDX,(short *)in_RCX);
    break;
  case 3:
    local_1 = DataTypeClampT<unsigned_short>
                        ((unsigned_short *)in_RSI,(unsigned_short *)in_RDX,(unsigned_short *)in_RCX)
    ;
    break;
  case 4:
    local_1 = DataTypeClampT<int>((int *)in_RSI,(int *)in_RDX,(int *)in_RCX);
    break;
  case 5:
    local_1 = DataTypeClampT<unsigned_int>((uint *)in_RSI,(uint *)in_RDX,(uint *)in_RCX);
    break;
  case 6:
    local_1 = DataTypeClampT<long_long>((longlong *)in_RSI,(longlong *)in_RDX,(longlong *)in_RCX);
    break;
  case 7:
    local_1 = DataTypeClampT<unsigned_long_long>
                        ((unsigned_long_long *)in_RSI,(unsigned_long_long *)in_RDX,
                         (unsigned_long_long *)in_RCX);
    break;
  case 8:
    local_1 = DataTypeClampT<float>((float *)in_RSI,(float *)in_RDX,(float *)in_RCX);
    break;
  case 9:
    local_1 = DataTypeClampT<double>(in_RSI,in_RDX,in_RCX);
    break;
  case 10:
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DataTypeClamp(ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max)
{
    switch (data_type)
    {
    case ImGuiDataType_S8:     return DataTypeClampT<ImS8  >((ImS8*  )p_data, (const ImS8*  )p_min, (const ImS8*  )p_max);
    case ImGuiDataType_U8:     return DataTypeClampT<ImU8  >((ImU8*  )p_data, (const ImU8*  )p_min, (const ImU8*  )p_max);
    case ImGuiDataType_S16:    return DataTypeClampT<ImS16 >((ImS16* )p_data, (const ImS16* )p_min, (const ImS16* )p_max);
    case ImGuiDataType_U16:    return DataTypeClampT<ImU16 >((ImU16* )p_data, (const ImU16* )p_min, (const ImU16* )p_max);
    case ImGuiDataType_S32:    return DataTypeClampT<ImS32 >((ImS32* )p_data, (const ImS32* )p_min, (const ImS32* )p_max);
    case ImGuiDataType_U32:    return DataTypeClampT<ImU32 >((ImU32* )p_data, (const ImU32* )p_min, (const ImU32* )p_max);
    case ImGuiDataType_S64:    return DataTypeClampT<ImS64 >((ImS64* )p_data, (const ImS64* )p_min, (const ImS64* )p_max);
    case ImGuiDataType_U64:    return DataTypeClampT<ImU64 >((ImU64* )p_data, (const ImU64* )p_min, (const ImU64* )p_max);
    case ImGuiDataType_Float:  return DataTypeClampT<float >((float* )p_data, (const float* )p_min, (const float* )p_max);
    case ImGuiDataType_Double: return DataTypeClampT<double>((double*)p_data, (const double*)p_min, (const double*)p_max);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}